

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O0

_Bool gravity_vm_set(gravity_vm *vm,char *key,gravity_value_t value)

{
  int iVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_class_t *pgVar3;
  char *key_local;
  gravity_vm *vm_local;
  gravity_value_t value_local;
  
  aVar2 = value.field_1;
  pgVar3 = value.isa;
  if (key != (char *)0x0) {
    iVar1 = strcmp(key,"gcEnabled");
    if ((iVar1 == 0) && (pgVar3 == gravity_class_bool)) {
      if ((gravity_float_t)aVar2.n == 0.0) {
        vm->gcenabled = vm->gcenabled + -1;
      }
      else {
        vm->gcenabled = vm->gcenabled + 1;
      }
      return true;
    }
    iVar1 = strcmp(key,"gcMinThreshold");
    if ((iVar1 == 0) && (pgVar3 == gravity_class_int)) {
      vm->gcminthreshold = (gravity_int_t)aVar2;
      return true;
    }
    iVar1 = strcmp(key,"gcThreshold");
    if ((iVar1 == 0) && (pgVar3 == gravity_class_int)) {
      vm->gcthreshold = (gravity_int_t)aVar2;
      return true;
    }
    iVar1 = strcmp(key,"gcRatio");
    if ((iVar1 == 0) && (pgVar3 == gravity_class_float)) {
      vm->gcratio = (gravity_float_t)aVar2;
      return true;
    }
    iVar1 = strcmp(key,"maxCCalls");
    if ((iVar1 == 0) && (pgVar3 == gravity_class_int)) {
      vm->maxccalls = value.field_1._0_4_;
      return true;
    }
    iVar1 = strcmp(key,"maxBlock");
    if ((iVar1 == 0) && (pgVar3 == gravity_class_int)) {
      vm->maxmemblock = aVar2.n & 0xffffffff;
      return true;
    }
    iVar1 = strcmp(key,"maxRecursionDepth");
    if ((iVar1 == 0) && (pgVar3 == gravity_class_int)) {
      vm->maxrecursion = aVar2.n & 0xffffffff;
      return true;
    }
  }
  return false;
}

Assistant:

bool gravity_vm_set (gravity_vm *vm, const char *key, gravity_value_t value) {
    if (key) {
        if ((strcmp(key, GRAVITY_VM_GCENABLED) == 0) && VALUE_ISA_BOOL(value)) {VALUE_AS_BOOL(value) ? ++vm->gcenabled : --vm->gcenabled ; return true;}
        if ((strcmp(key, GRAVITY_VM_GCMINTHRESHOLD) == 0) && VALUE_ISA_INT(value)) {vm->gcminthreshold = VALUE_AS_INT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_GCTHRESHOLD) == 0) && VALUE_ISA_INT(value)) {vm->gcthreshold = VALUE_AS_INT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_GCRATIO) == 0) && VALUE_ISA_FLOAT(value)) {vm->gcratio = VALUE_AS_FLOAT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_MAXCALLS) == 0) && VALUE_ISA_INT(value)) {vm->maxccalls = (uint32_t)VALUE_AS_INT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_MAXBLOCK) == 0) && VALUE_ISA_INT(value)) {vm->maxmemblock = (uint32_t)VALUE_AS_INT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_MAXRECURSION) == 0) && VALUE_ISA_INT(value)) {vm->maxrecursion = (uint32_t)VALUE_AS_INT(value); return true;}
    }
    return false;
}